

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O1

int __thiscall Fl_Group::remove(Fl_Group *this,char *__filename)

{
  int iVar1;
  Fl_Widget ***pppFVar2;
  int iVar3;
  Fl_Widget ***__ptr;
  Fl_Widget *pFVar4;
  Fl_Widget **ppFVar5;
  int in_EAX;
  int extraout_EAX;
  ulong extraout_RAX;
  ulong uVar6;
  Fl_Widget ***pppFVar7;
  int iVar8;
  uint uVar9;
  
  iVar8 = (int)__filename;
  if ((-1 < iVar8) && (iVar3 = this->children_, iVar8 < iVar3)) {
    pppFVar2 = &this->array_;
    __ptr = (Fl_Widget ***)this->array_;
    pppFVar7 = __ptr;
    if (iVar3 < 2) {
      pppFVar7 = pppFVar2;
    }
    uVar6 = (ulong)__filename & 0xffffffff;
    pFVar4 = (Fl_Widget *)pppFVar7[uVar6];
    if (pFVar4 == this->savedfocus_) {
      this->savedfocus_ = (Fl_Widget *)0x0;
    }
    if (pFVar4->parent_ == this) {
      pFVar4->parent_ = (Fl_Group *)0x0;
    }
    iVar1 = iVar3 + -1;
    this->children_ = iVar1;
    if (iVar1 == 1) {
      ppFVar5 = __ptr[iVar8 == 0];
      free(__ptr);
      *pppFVar2 = ppFVar5;
      uVar6 = extraout_RAX;
    }
    else if (iVar8 < iVar1 && 2 < iVar3) {
      uVar6 = uVar6 + 1;
      do {
        (*pppFVar2)[uVar6 - 1] = (*pppFVar2)[uVar6];
        uVar6 = uVar6 + 1;
        uVar9 = (int)__filename + 1;
        __filename = (char *)(ulong)uVar9;
      } while ((int)uVar9 < iVar1);
    }
    in_EAX = (int)uVar6;
    if (this->sizes_ != (int *)0x0) {
      operator_delete__(this->sizes_);
      in_EAX = extraout_EAX;
    }
    this->sizes_ = (int *)0x0;
  }
  return in_EAX;
}

Assistant:

void Fl_Group::remove(int index) {
  if (index < 0 || index >= children_) return;
  Fl_Widget &o = *child(index);
  if (&o == savedfocus_) savedfocus_ = 0;
  if (o.parent_ == this) {	// this should always be true
    o.parent_ = 0;
  } 

  // remove the widget from the group

  children_--;
  if (children_ == 1) { // go from 2 to 1 child
    Fl_Widget *t = array_[!index];
    free((void*)array_);
    array_ = (Fl_Widget**)t;
  } else if (children_ > 1) { // delete from array
    for (; index < children_; index++) array_[index] = array_[index+1];
  }
  init_sizes();
}